

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  int n_1;
  float width_rounded;
  int n;
  int item_n;
  float width_to_remove_per_item;
  float max_width_to_remove_per_item;
  int count_same_width;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined2 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  bool bVar2;
  undefined1 in_stack_ffffffffffffffd3;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_14;
  float local_10;
  
  if (in_ESI == 1) {
    if (0.0 <= *(float *)(in_RDI + 4)) {
      fVar1 = ImMax<float>(*(float *)(in_RDI + 4) - in_XMM0_Da,1.0);
      *(float *)(in_RDI + 4) = fVar1;
    }
  }
  else {
    ImQsort((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            CONCAT44(in_stack_ffffffffffffffd4,
                     CONCAT13(in_stack_ffffffffffffffd3,
                              CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0))),
            (_func_int_void_ptr_void_ptr *)
            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_14 = 1;
    for (local_10 = in_XMM0_Da; 0.0 < local_10 && local_14 < in_ESI;
        local_10 = -fVar1 * (float)local_14 + local_10) {
      while( true ) {
        bVar2 = false;
        if (local_14 < in_ESI) {
          bVar2 = *(float *)(in_RDI + 4) <= *(float *)(in_RDI + 4 + (long)local_14 * 8);
        }
        if (!bVar2) break;
        local_14 = local_14 + 1;
      }
      if ((in_ESI <= local_14) || (*(float *)(in_RDI + 4 + (long)local_14 * 8) < 0.0)) {
        fVar1 = *(float *)(in_RDI + 4) - 1.0;
      }
      else {
        fVar1 = *(float *)(in_RDI + 4) - *(float *)(in_RDI + 4 + (long)local_14 * 8);
      }
      if (fVar1 <= 0.0) break;
      fVar1 = ImMin<float>(local_10 / (float)local_14,fVar1);
      for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
        *(float *)(in_RDI + 4 + (long)iVar3 * 8) = *(float *)(in_RDI + 4 + (long)iVar3 * 8) - fVar1;
      }
    }
    local_10 = 0.0;
    for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
      fVar1 = ImFloor(*(float *)(in_RDI + 4 + (long)iVar3 * 8));
      local_10 = (*(float *)(in_RDI + 4 + (long)iVar3 * 8) - fVar1) + local_10;
      *(float *)(in_RDI + 4 + (long)iVar3 * 8) = fVar1;
    }
    if (0.0 < local_10) {
      for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
        if (*(int *)(in_RDI + (long)iVar3 * 8) < (int)(local_10 + 0.01)) {
          *(float *)(in_RDI + 4 + (long)iVar3 * 8) = *(float *)(in_RDI + 4 + (long)iVar3 * 8) + 1.0;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}